

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O0

void __thiscall md::Code::add_long(Code *this,uint32_t longword)

{
  uint32_t longword_local;
  Code *this_local;
  
  add_word(this,(uint16_t)(longword >> 0x10));
  add_word(this,(uint16_t)longword);
  return;
}

Assistant:

void Code::add_long(uint32_t longword)
{
    this->add_word(static_cast<uint16_t>(longword >> 16));
    this->add_word(static_cast<uint16_t>(longword & 0xFFFF));
}